

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_manager.cc
# Opt level: O2

RC __thiscall PF_Manager::CloseFile(PF_Manager *this,PF_FileHandle *fileHandle)

{
  RC RVar1;
  int iVar2;
  
  if (fileHandle->bFileOpen != 0) {
    RVar1 = PF_FileHandle::FlushPages(fileHandle);
    if (RVar1 == 0) {
      iVar2 = close(fileHandle->unixfd);
      if (iVar2 < 0) {
        RVar1 = -0xb;
      }
      else {
        fileHandle->bFileOpen = 0;
        fileHandle->pBufferMgr = (PF_BufferMgr *)0x0;
        RVar1 = 0;
      }
    }
    return RVar1;
  }
  return 5;
}

Assistant:

RC PF_Manager::CloseFile(PF_FileHandle &fileHandle)
{
   RC rc;

   // Ensure fileHandle refers to open file
   if (!fileHandle.bFileOpen)
      return (PF_CLOSEDFILE);

   // Flush all buffers for this file and write out the header
   if ((rc = fileHandle.FlushPages()))
      return (rc);

   // Close the file
   if (close(fileHandle.unixfd) < 0)
      return (PF_UNIX);
   fileHandle.bFileOpen = FALSE;

   // Reset the buffer manager pointer in the file handle
   fileHandle.pBufferMgr = NULL;

   // Return ok
   return 0;
}